

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void xatlas::DestroyOutputMeshes(Context *ctx)

{
  Mesh *pMVar1;
  uint local_24;
  uint32_t j;
  Mesh *mesh;
  int i;
  Context *ctx_local;
  
  if ((ctx->atlas).meshes != (Mesh *)0x0) {
    for (mesh._4_4_ = 0; mesh._4_4_ < (int)(ctx->atlas).meshCount; mesh._4_4_ = mesh._4_4_ + 1) {
      pMVar1 = (ctx->atlas).meshes + mesh._4_4_;
      if (pMVar1->chartArray != (Chart *)0x0) {
        for (local_24 = 0; local_24 < pMVar1->chartCount; local_24 = local_24 + 1) {
          if (pMVar1->chartArray[local_24].faceArray != (uint32_t *)0x0) {
            internal::Realloc(pMVar1->chartArray[local_24].faceArray,0,0,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                              ,0x22d2);
          }
        }
        internal::Realloc(pMVar1->chartArray,0,0,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                          ,0x22d4);
      }
      if (pMVar1->vertexArray != (Vertex *)0x0) {
        internal::Realloc(pMVar1->vertexArray,0,0,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                          ,0x22d7);
      }
      if (pMVar1->indexArray != (uint32_t *)0x0) {
        internal::Realloc(pMVar1->indexArray,0,0,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                          ,0x22d9);
      }
    }
    internal::Realloc((ctx->atlas).meshes,0,0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                      ,0x22db);
    (ctx->atlas).meshes = (Mesh *)0x0;
  }
  return;
}

Assistant:

static void DestroyOutputMeshes(Context *ctx)
{
	if (!ctx->atlas.meshes)
		return;
	for (int i = 0; i < (int)ctx->atlas.meshCount; i++) {
		Mesh &mesh = ctx->atlas.meshes[i];
		if (mesh.chartArray) {
			for (uint32_t j = 0; j < mesh.chartCount; j++) {
				if (mesh.chartArray[j].faceArray)
					XA_FREE(mesh.chartArray[j].faceArray);
			}
			XA_FREE(mesh.chartArray);
		}
		if (mesh.vertexArray)
			XA_FREE(mesh.vertexArray);
		if (mesh.indexArray)
			XA_FREE(mesh.indexArray);
	}
	XA_FREE(ctx->atlas.meshes);
	ctx->atlas.meshes = nullptr;
}